

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type)

{
  int iVar1;
  
  iVar1 = type >> 0x10;
  if ((uint)type < 0x10000) {
    iVar1 = type;
  }
  if (iVar1 - 1U < 2) {
    to_pixels(this,pixels,type,this->w * 3);
    return;
  }
  if (iVar1 == 4) {
    to_pixels(this,pixels,type,this->w << 2);
    return;
  }
  if (iVar1 == 3) {
    to_pixels(this,pixels,type,this->w);
    return;
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type) const
{
    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        to_pixels(pixels, type, w * 3);
    }
    else if (type_to == PIXEL_GRAY)
    {
        to_pixels(pixels, type, w * 1);
    }
    else if (type_to == PIXEL_RGBA)
    {
        to_pixels(pixels, type, w * 4);
    }
}